

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

HANDLE PAL_RemoteHandleToLocal(RHANDLE rhRemote)

{
  undefined1 *local_28;
  HANDLE hLocal;
  CPalThread *pthr;
  RHANDLE p_Stack_10;
  PAL_ERROR palError;
  RHANDLE rhRemote_local;
  
  pthr._4_4_ = 0;
  local_28 = &DAT_ffffffffffffffff;
  p_Stack_10 = rhRemote;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  hLocal = CorUnix::InternalGetCurrentThread();
  pthr._4_4_ = CorUnix::CSharedMemoryObjectManager::ConvertRemoteHandleToLocal
                         (CorUnix::g_pObjectManager,(CPalThread *)hLocal,p_Stack_10,&local_28);
  if (pthr._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pthr._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_28;
}

Assistant:

PALIMPORT
HANDLE
PALAPI
PAL_RemoteHandleToLocal(IN RHANDLE rhRemote)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr;
    HANDLE hLocal = INVALID_HANDLE_VALUE;

    PERF_ENTRY(PAL_RemoteHandleToLocal);
    ENTRY("PAL_RemoteHandleToLocal( hRemote=0x%lx )\n", rhRemote);

    pthr = InternalGetCurrentThread();

    palError = static_cast<CSharedMemoryObjectManager*>(g_pObjectManager)->ConvertRemoteHandleToLocal(
        pthr,
        rhRemote,
        &hLocal
        );

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }
    
    LOGEXIT("PAL_RemoteHandleToLocal returns HANDLE 0x%lx\n", hLocal);
    PERF_EXIT(PAL_RemoteHandleToLocal);
    return hLocal;
}